

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queries.c
# Opt level: O1

_Bool intersect_box3_ray3(box3_t b,ray3_t r)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar1 = (b.min.x - r.start.x) / r.direction.x;
  fVar4 = (b.max.x - r.start.x) / r.direction.x;
  fVar2 = fVar1;
  if (fVar4 <= fVar1) {
    fVar2 = fVar4;
  }
  if (fVar1 <= fVar4) {
    fVar1 = fVar4;
  }
  fVar4 = (b.min.y - r.start.y) / r.direction.y;
  fVar5 = (b.max.y - r.start.y) / r.direction.y;
  fVar3 = fVar4;
  if (fVar5 <= fVar4) {
    fVar3 = fVar5;
  }
  if (fVar2 <= fVar3) {
    fVar2 = fVar3;
  }
  if (fVar4 <= fVar5) {
    fVar4 = fVar5;
  }
  if (fVar4 <= fVar1) {
    fVar1 = fVar4;
  }
  fVar4 = (b.min.z - r.start.z) / r.direction.z;
  fVar5 = (b.max.z - r.start.z) / r.direction.z;
  fVar3 = fVar4;
  if (fVar5 <= fVar4) {
    fVar3 = fVar5;
  }
  if (fVar2 <= fVar3) {
    fVar2 = fVar3;
  }
  if (fVar4 <= fVar5) {
    fVar4 = fVar5;
  }
  if (fVar4 <= fVar1) {
    fVar1 = fVar4;
  }
  if (fVar2 <= 0.0) {
    fVar2 = 0.0;
  }
  return fVar2 < fVar1;
}

Assistant:

bool
intersect_box3_ray3(box3_t b, ray3_t r) {
    // From the paper: An Efficient and Robust Ray–Box Intersection Algorithm by A. Williams et. al.
    // "... Note also that since IEEE arithmetic guarantees that a positive number divided by zero
    // is +\infinity and a negative number divided by zero is -\infinity, the code works for vertical
    // and horizontal line ..."
    float   tmin = -INFINITY, tmax = INFINITY;

    float   t0, t1;

    t0  = (b.min.x - r.start.x) / r.direction.x;
    t1  = (b.max.x - r.start.x) / r.direction.x;

    tmin    = MAX(tmin, MIN(t0, t1));
    tmax    = MIN(tmax, MAX(t0, t1));

    t0  = (b.min.y - r.start.y) / r.direction.y;
    t1  = (b.max.y - r.start.y) / r.direction.y;

    tmin    = MAX(tmin, MIN(t0, t1));
    tmax    = MIN(tmax, MAX(t0, t1));


    t0  = (b.min.z - r.start.z) / r.direction.z;
    t1  = (b.max.z - r.start.z) / r.direction.z;

    tmin    = MAX(tmin, MIN(t0, t1));
    tmax    = MIN(tmax, MAX(t0, t1));


    return tmax > MAX(tmin, 0.0f);
}